

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
SMBusSimulationDataGenerator::OutputPMBusGroupCommand(SMBusSimulationDataGenerator *this)

{
  U8 UVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  U8 pec;
  SMBusSimulationDataGenerator *this_local;
  
  OutputStart(this);
  bVar2 = OutputAddr(this,'C',false,true);
  bVar2 = ""[(int)(uint)bVar2];
  bVar3 = OutputByte(this,'%',true);
  bVar2 = ""[(int)(uint)(bVar2 ^ bVar3)];
  bVar3 = OutputByte(this,'\x01',true);
  bVar2 = ""[(int)(uint)(bVar2 ^ bVar3)];
  bVar3 = OutputByte(this,'$',true);
  UVar1 = ""[(int)(uint)(bVar2 ^ bVar3)];
  bVar4 = SMBusAnalyzerSettings::CalcPEC(this->mSettings);
  if (bVar4) {
    OutputByte(this,UVar1,true);
  }
  OutputStart(this);
  bVar2 = OutputAddr(this,'D',false,true);
  bVar2 = ""[(int)(uint)bVar2];
  bVar3 = OutputByte(this,'%',true);
  bVar2 = ""[(int)(uint)(bVar2 ^ bVar3)];
  bVar3 = OutputByte(this,'s',true);
  bVar2 = ""[(int)(uint)(bVar2 ^ bVar3)];
  bVar3 = OutputByte(this,'(',true);
  UVar1 = ""[(int)(uint)(bVar2 ^ bVar3)];
  bVar4 = SMBusAnalyzerSettings::CalcPEC(this->mSettings);
  if (bVar4) {
    OutputByte(this,UVar1,true);
  }
  OutputStart(this);
  bVar2 = OutputAddr(this,'E',false,true);
  bVar2 = ""[(int)(uint)bVar2];
  bVar3 = OutputByte(this,'%',true);
  bVar2 = ""[(int)(uint)(bVar2 ^ bVar3)];
  bVar3 = OutputByte(this,'$',true);
  bVar2 = ""[(int)(uint)(bVar2 ^ bVar3)];
  bVar3 = OutputByte(this,0x88,true);
  UVar1 = ""[(int)(uint)(bVar2 ^ bVar3)];
  bVar4 = SMBusAnalyzerSettings::CalcPEC(this->mSettings);
  if (bVar4) {
    OutputByte(this,UVar1,true);
  }
  OutputStart(this);
  bVar2 = OutputAddr(this,'F',false,true);
  bVar2 = ""[(int)(uint)bVar2];
  bVar3 = OutputByte(this,' ',true);
  bVar2 = ""[(int)(uint)(bVar2 ^ bVar3)];
  bVar3 = OutputByte(this,'\x11',true);
  UVar1 = ""[(int)(uint)(bVar2 ^ bVar3)];
  bVar4 = SMBusAnalyzerSettings::CalcPEC(this->mSettings);
  if (bVar4) {
    OutputByte(this,UVar1,true);
  }
  OutputStop(this);
  AdvanceAllBySec(this,0.0005);
  return;
}

Assistant:

void SMBusSimulationDataGenerator::OutputPMBusGroupCommand()
{
    U8 pec;

    OutputStart();
    pec = 0;
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x43, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( VOUT_MARGIN_HIGH ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x01 ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x24 ) ];
    if( mSettings->CalcPEC() )
        OutputByte( pec );

    OutputStart();
    pec = 0;
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x44, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( VOUT_MARGIN_HIGH ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x73 ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x28 ) ];
    if( mSettings->CalcPEC() )
        OutputByte( pec );

    OutputStart();
    pec = 0;
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x45, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( VOUT_MARGIN_HIGH ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x24 ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x88 ) ];
    if( mSettings->CalcPEC() )
        OutputByte( pec );

    OutputStart();
    pec = 0;
    pec = SMBusCRCLookup[ pec ^ OutputAddr( 0x46, false ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( VOUT_MODE ) ];
    pec = SMBusCRCLookup[ pec ^ OutputByte( 0x11 ) ];
    if( mSettings->CalcPEC() )
        OutputByte( pec );

    OutputStop();

    AdvanceAllBySec( ONE_MS * 0.5 );
}